

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdArgs.cpp
# Opt level: O0

void __thiscall asl::CmdArgs::CmdArgs(CmdArgs *this,String *spec)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  char *txt;
  char **argv;
  size_t in_RCX;
  Array<asl::String> local_1e8;
  String local_1e0;
  char local_1c1;
  Array<asl::String> local_1c0;
  Array<asl::String> a;
  int j;
  int i;
  int local_1a4;
  int n;
  Array<char> all;
  char buffer [256];
  String local_88;
  undefined1 local_70 [8];
  File file;
  String *spec_local;
  CmdArgs *this_local;
  
  Array<asl::String>::Array(&this->_args);
  Array<asl::String>::Array(&this->_rest);
  Dic<asl::String>::Dic(&this->_opts);
  Dic<asl::Array<asl::String>_>::Dic(&this->_multi);
  Array<asl::String>::Array(&this->_unused);
  asl::String::String(&local_88,"/proc/self/cmdline");
  File::File((File *)local_70,&local_88,READ);
  asl::String::~String(&local_88);
  bVar1 = File::operator!((File *)local_70);
  if (!bVar1) {
    Array<char>::Array((Array<char> *)&stack0xfffffffffffffe60);
    do {
      sVar3 = File::read((File *)local_70,(int)&all,(void *)0x100,in_RCX);
      local_1a4 = (int)sVar3;
      if (local_1a4 < 1) break;
      Array<char>::Array((Array<char> *)&j,(char *)&all,local_1a4);
      Array<char>::append((Array<char> *)&stack0xfffffffffffffe60,(Array<char> *)&j);
      Array<char>::~Array((Array<char> *)&j);
    } while (0x100 < local_1a4);
    iVar2 = Array<char>::length((Array<char> *)&stack0xfffffffffffffe60);
    if (iVar2 != 0) {
      a._a._4_4_ = 0;
      a._a._0_4_ = 0;
      Array<asl::String>::Array(&local_1c0);
      while( true ) {
        local_1c1 = '\0';
        a._a._0_4_ = Array<char>::indexOf
                               ((Array<char> *)&stack0xfffffffffffffe60,&local_1c1,a._a._4_4_);
        if ((int)a._a == -1) break;
        txt = Array<char>::operator[]((Array<char> *)&stack0xfffffffffffffe60,a._a._4_4_);
        asl::String::String(&local_1e0,txt);
        Array<asl::String>::operator<<(&local_1c0,&local_1e0);
        asl::String::~String(&local_1e0);
        a._a._4_4_ = (int)a._a + 1;
      }
      iVar2 = Array<asl::String>::length(&local_1c0);
      Array<asl::String>::with<char_const*>(&local_1e8);
      argv = Array<const_char_*>::data((Array<const_char_*> *)&local_1e8);
      parse(this,iVar2,argv,spec);
      Array<const_char_*>::~Array((Array<const_char_*> *)&local_1e8);
      Array<asl::String>::~Array(&local_1c0);
    }
    Array<char>::~Array((Array<char> *)&stack0xfffffffffffffe60);
  }
  File::~File((File *)local_70);
  return;
}

Assistant:

CmdArgs::CmdArgs(const String& spec)
{
#ifdef _WIN32
	int nArgs = 0;
	LPWSTR* wargs = CommandLineToArgvW(GetCommandLineW(), &nArgs);
	if (wargs == NULL)
		return;
	Array<String> a;
	for (int i = 0; i < nArgs; i++)
		a << wargs[i];

	LocalFree(wargs);
	parse(-nArgs, (char**)(a.with<const char*>()).data(), spec);
#else
	File file("/proc/self/cmdline", File::READ);
	if (!file)
		return;
	char buffer[256];
	Array<char> all;
	int n;
	while ((n = file.read(buffer, sizeof(buffer))) > 0)
	{
		all.append(Array<char>((char*)buffer, n));
		if (n <= (int)sizeof(buffer))
			break;
	}
	if (all.length() == 0)
		return;
	int i = 0, j = 0;
	Array<String> a;
	while ((j = all.indexOf('\0', i)) != -1)
	{
		a << String(&all[i]);
		i = j + 1;
	}

	parse(a.length(), (char**)(a.with<const char*>()).data(), spec);
#endif
}